

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<SpvExecutionMode_,_8UL>::SmallVector
          (SmallVector<SpvExecutionMode_,_8UL> *this)

{
  SpvExecutionMode_ *pSVar1;
  SmallVector<SpvExecutionMode_,_8UL> *this_local;
  
  VectorView<SpvExecutionMode_>::VectorView(&this->super_VectorView<SpvExecutionMode_>);
  this->buffer_capacity = 0;
  pSVar1 = AlignedBuffer<SpvExecutionMode_,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<SpvExecutionMode_>).ptr = pSVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}